

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactShape.h
# Opt level: O2

void __thiscall cbtGImpactMeshShape::~cbtGImpactMeshShape(cbtGImpactMeshShape *this)

{
  void *in_RSI;
  
  ~cbtGImpactMeshShape(this);
  cbtConcaveShape::operator_delete((cbtConcaveShape *)this,in_RSI);
  return;
}

Assistant:

virtual ~cbtGImpactMeshShape()
	{
		int i = m_mesh_parts.size();
		while (i--)
		{
			cbtGImpactMeshShapePart* part = m_mesh_parts[i];
			delete part;
		}
		m_mesh_parts.clear();
	}